

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Dir_align *s)

{
  Expression *pEVar1;
  uint uVar2;
  allocator local_79;
  string local_78 [2];
  Value_type local_20;
  uint16_t local_1a;
  Value_type size_type;
  uint16_t size_value;
  Dir_align *s_local;
  Code_generator *this_local;
  
  _size_type = s;
  s_local = (Dir_align *)this;
  uVar2 = (*s->size->_vptr_Expression[3])();
  if ((uVar2 & 1) != 0) {
    local_1a = ast::Expression::get_value(_size_type->size);
    local_20 = ast::Expression::get_type(_size_type->size);
    if (local_20 == ABSOLUTE) {
      ast::Sections::fill((_size_type->super_Directive).super_Statement.section_index,
                          (_size_type->super_Directive).super_Statement.section_offset,'\0',
                          (_size_type->super_Directive).super_Statement.size_in_memory);
    }
    else if (local_20 == LABEL) {
      pEVar1 = _size_type->size;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_78,"Can\'t be a label, must be a constant",&local_79);
      error_report(&pEVar1->location,local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
  }
  return;
}

Assistant:

void Code_generator::visit(Dir_align *s)
{
	if (s->size->evaluate()) {
		auto size_value = s->size->get_value();
		auto size_type = s->size->get_type();
		if (size_type == ABSOLUTE) {
			if (size_value < 0 && size_value > 1)
				warning_report(&s->size->location, "Invalid value for alignment. Must be 1 or 0");
			Sections::fill(s->section_index, s->section_offset, 0, s->size_in_memory);
		}
		else if (size_type == Value_type::LABEL)
			error_report(&s->size->location,"Can't be a label, must be a constant");
	}
}